

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

int tcv_get_temperature(tcv_t *tcv,int16_t *temp)

{
  _func_int_tcv_t_ptr_int16_t_ptr *p_Var1;
  int iVar2;
  bool bVar3;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->created != true)) {
    bVar3 = false;
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    bVar3 = iVar2 == 0;
  }
  iVar2 = -4;
  if ((temp != (int16_t *)0x0) && (bVar3)) {
    p_Var1 = tcv->fun->get_temp;
    if (p_Var1 == (_func_int_tcv_t_ptr_int16_t_ptr *)0x0) {
      iVar2 = -0xc;
    }
    else {
      iVar2 = (*p_Var1)(tcv,temp);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar2;
}

Assistant:

int tcv_get_temperature(tcv_t* tcv, int16_t* temp)
{
	/* Not all have Digital diagnostics */
	int ret = TCV_ERR_FEATURE_NOT_AVAILABLE;

	if (!tcv_check_and_lock_ok(tcv) || !temp)
		return TCV_ERR_INVALID_ARG;

	if (tcv->fun->get_temp)
		ret = tcv->fun->get_temp(tcv, temp);

	tcv_unlock(tcv);
	return ret;
}